

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushItemWidth(float item_width)

{
  ImVector<float> *pIVar1;
  ImGuiWindow *pIVar2;
  float *__src;
  ImGuiContext *pIVar3;
  int iVar4;
  float *__dest;
  int iVar5;
  int iVar6;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  iVar4 = (pIVar2->DC).ItemWidthStack.Size;
  if (iVar4 == (pIVar2->DC).ItemWidthStack.Capacity) {
    if (iVar4 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar4 / 2 + iVar4;
    }
    iVar6 = iVar4 + 1;
    if (iVar4 + 1 < iVar5) {
      iVar6 = iVar5;
    }
    __dest = (float *)MemAlloc((long)iVar6 << 2);
    __src = (pIVar2->DC).ItemWidthStack.Data;
    if (__src != (float *)0x0) {
      memcpy(__dest,__src,(long)(pIVar2->DC).ItemWidthStack.Size << 2);
      MemFree((pIVar2->DC).ItemWidthStack.Data);
    }
    (pIVar2->DC).ItemWidthStack.Data = __dest;
    (pIVar2->DC).ItemWidthStack.Capacity = iVar6;
    iVar4 = (pIVar2->DC).ItemWidthStack.Size;
  }
  else {
    __dest = (pIVar2->DC).ItemWidthStack.Data;
  }
  __dest[iVar4] = (pIVar2->DC).ItemWidth;
  pIVar1 = &(pIVar2->DC).ItemWidthStack;
  pIVar1->Size = pIVar1->Size + 1;
  if ((item_width == 0.0) && (!NAN(item_width))) {
    item_width = pIVar2->ItemWidthDefault;
  }
  (pIVar2->DC).ItemWidth = item_width;
  *(byte *)&(pIVar3->NextItemData).Flags = (byte)(pIVar3->NextItemData).Flags & 0xfe;
  return;
}

Assistant:

void ImGui::PushItemWidth(float item_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.ItemWidthStack.push_back(window->DC.ItemWidth); // Backup current width
    window->DC.ItemWidth = (item_width == 0.0f ? window->ItemWidthDefault : item_width);
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}